

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

ScenarioUpperBound * __thiscall
despot::Chain::CreateScenarioUpperBound(Chain *this,string *name,string particle_bound_name)

{
  bool bVar1;
  TrivialParticleUpperBound *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_00 = (TrivialParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound(this_00,&this->super_DSPOMDP);
  }
  else {
    bVar1 = std::operator==(name,"LOOKAHEAD");
    if (bVar1) {
      this_00 = (TrivialParticleUpperBound *)operator_new(8);
      despot::ParticleUpperBound::ParticleUpperBound((ParticleUpperBound *)this_00);
      *(undefined ***)this_00 = &PTR__ParticleUpperBound_00110c18;
    }
    else {
      bVar1 = std::operator==(name,"MDP");
      if (!bVar1) {
        bVar1 = std::operator==(name,"DEFAULT");
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
          poVar2 = std::operator<<(poVar2,(string *)name);
          std::endl<char,std::char_traits<char>>(poVar2);
          exit(1);
        }
      }
      this_00 = (TrivialParticleUpperBound *)operator_new(8);
      ApproxMDPChainParticleUpperBound::ApproxMDPChainParticleUpperBound
                ((ApproxMDPChainParticleUpperBound *)this_00);
    }
  }
  return (ScenarioUpperBound *)this_00;
}

Assistant:

ScenarioUpperBound* Chain::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "LOOKAHEAD") {
		return new OneStepLookaheadChainParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new ApproxMDPChainParticleUpperBound();
	} else {
		cerr << "Unsupported base upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}